

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::WhileStmt> __thiscall
mocker::Parser::whileStmt(Parser *this,TokIter *iter,TokIter end)

{
  Token *pTVar1;
  Position end_00;
  TokIter TVar2;
  TokIter TVar3;
  TokenID TVar4;
  Expression *__tmp;
  mapped_type *pmVar5;
  CompileError *this_00;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  Statement *__tmp_1;
  TokIter TVar7;
  bool bVar8;
  shared_ptr<mocker::ast::WhileStmt> sVar9;
  Position beg;
  Position beg_00;
  Position end_01;
  undefined1 local_98 [16];
  shared_ptr<mocker::ast::Statement> body;
  shared_ptr<mocker::ast::Expression> condition;
  Parser local_58;
  size_t local_40;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  Token::position(*end._M_current);
  TVar3._M_current = local_58.tokEnd._M_current;
  TVar2._M_current = local_58.tokBeg._M_current;
  _Var6._M_pi = extraout_RDX;
  if ((*end._M_current == in_RCX) ||
     (TVar4 = Token::tokenID(*end._M_current), _Var6._M_pi = extraout_RDX_00, TVar4 != While)) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
    goto LAB_0017e7f1;
  }
  pTVar1 = (Token *)(*(long *)end._M_current + 0x38);
  condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(long *)end._M_current = *(long *)end._M_current + 0x70;
  if ((pTVar1 == in_RCX) || (TVar4 = Token::tokenID(pTVar1), TVar4 != LeftParen)) goto LAB_0017e805;
  local_58.tokBeg._M_current = (Token *)logicalOrExpr;
  local_58.tokEnd._M_current = (Token *)0x0;
  local_38 = 0x2f;
  local_58.pos = (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                  *)iter;
  auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
            ((Parser *)local_98,iter,end,
             (_Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
              *)in_RCX,(pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> *)&local_58);
  condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
  condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_98._0_8_;
  local_98._0_8_ = (Token *)0x0;
  local_98._8_8_ = (Token *)0x0;
  bVar8 = true;
  if ((Token *)condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr == (Token *)0x0) {
LAB_0017e777:
    TVar7._M_current = (Token *)0x0;
  }
  else {
    pTVar1 = *end._M_current;
    *(Token **)end._M_current = pTVar1 + 1;
    if (pTVar1 == in_RCX) goto LAB_0017e777;
    TVar4 = Token::tokenID(pTVar1);
    TVar7._M_current = (Token *)0x0;
    if (TVar4 == RightParen) {
      statement(&local_58,iter,end);
      body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_58.tokBeg._M_current;
      body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.tokEnd._M_current;
      bVar8 = local_58.tokBeg._M_current == (Token *)0x0;
      TVar7._M_current = local_58.tokBeg._M_current;
    }
  }
  if ((Token *)local_98._8_8_ != (Token *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if (bVar8) {
LAB_0017e805:
    this_00 = (CompileError *)__cxa_allocate_exception(0x48);
    Token::position(*end._M_current);
    end_00.col = local_40;
    end_00.line = (size_t)local_58.pos;
    beg_00.col = (size_t)TVar3._M_current;
    beg_00.line = (size_t)TVar2._M_current;
    CompileError::CompileError(this_00,beg_00,end_00);
    *(undefined ***)this_00 = &PTR__CompileError_001eba98;
    __cxa_throw(this_00,&SyntaxError::typeinfo,CompileError::~CompileError);
  }
  local_58.tokBeg._M_current = TVar7._M_current;
  pmVar5 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)iter[2]._M_current,(key_type *)&local_58);
  beg.col = (size_t)TVar2._M_current;
  beg.line = (size_t)iter;
  end_01.col = (pmVar5->second).line;
  end_01.line = (size_t)TVar3._M_current;
  sVar9 = makeNode<mocker::ast::WhileStmt,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Statement>&>
                    (this,beg,end_01,(shared_ptr<mocker::ast::Expression> *)(pmVar5->second).col,
                     (shared_ptr<mocker::ast::Statement> *)&condition);
  _Var6 = sVar9.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (body.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var6._M_pi = extraout_RDX_01;
  }
  if (condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var6._M_pi = extraout_RDX_02;
  }
LAB_0017e7f1:
  sVar9.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar9.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::WhileStmt>)
         sVar9.super___shared_ptr<mocker::ast::WhileStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::WhileStmt> Parser::whileStmt(TokIter &iter, TokIter end) {
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  if (id(iter) != TokenID::While)
    return nullptr;
  ++iter;
  std::shared_ptr<ast::Expression> condition;
  std::shared_ptr<ast::Statement> body;
  if (id(iter++) != TokenID::LeftParen ||
      !(condition = expression(iter, end)) ||
      id(iter++) != TokenID::RightParen || !(body = statement(iter, end)))
    throw SyntaxError(begPos, iter->position().second);
  return makeNode<ast::WhileStmt>(begPos, pos[body->getID()].second, condition,
                                  body);
}